

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hblas2.cxx
# Opt level: O0

void HBLAS2::hblas2_gemv_square_LDSame<double,double,(char)78>(void)

{
  bool bVar1;
  ostream *poVar2;
  quaternion<double> *__x;
  quaternion<double> *__y;
  void *pvVar3;
  quaternion<double> *Y_00;
  reference __x_00;
  quaternion<double> tmp;
  int32_t AStride;
  int32_t ACOL;
  int32_t AROW;
  int i;
  stringstream ss;
  double BETA;
  double ALPHA;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> YC;
  quaternion<double> *x_2;
  iterator __end2_2;
  iterator __begin2_2;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *__range2_2;
  quaternion<double> *x_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *__range2_1;
  quaternion<double> *x;
  iterator __end2;
  iterator __begin2;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *__range2;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> Y;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> X;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> A;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *in_stack_fffffffffffff9b8;
  undefined1 pv_;
  quaternion<double> *__y_00;
  uniform_real_distribution<double> *in_stack_fffffffffffff9c0;
  undefined4 uVar4;
  undefined4 in_stack_fffffffffffff9cc;
  allocator_type *in_stack_fffffffffffff9d0;
  undefined7 in_stack_fffffffffffff9d8;
  undefined1 in_stack_fffffffffffff9df;
  quaternion<double> *in_stack_fffffffffffff9e0;
  quaternion<double> *in_stack_fffffffffffff9e8;
  undefined8 in_stack_fffffffffffff9f0;
  int32_t iVar6;
  undefined8 uVar5;
  quaternion<double> *in_stack_fffffffffffff9f8;
  undefined4 in_stack_fffffffffffffa00;
  undefined4 in_stack_fffffffffffffa04;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
  *in_stack_fffffffffffffa08;
  size_type __n;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
  *in_stack_fffffffffffffa10;
  quaternion<double> *__q;
  int32_t INCX;
  int32_t INCY;
  basic_cstring<const_char> local_510;
  basic_cstring<const_char> local_500;
  undefined1 local_4f0 [32];
  undefined8 local_4d0;
  undefined1 local_408 [24];
  undefined1 local_3f0 [16];
  basic_cstring<const_char> local_3e0;
  double local_3d0;
  double local_3c8;
  double local_3c0;
  double local_3b8;
  double local_3b0;
  double local_3a8;
  double local_3a0;
  double local_398;
  double local_390;
  double local_388;
  double local_380;
  double in_stack_fffffffffffffc88;
  undefined4 uVar7;
  int iVar8;
  int iVar9;
  int INCX_00;
  quaternion<double> *in_stack_fffffffffffffca0;
  int32_t in_stack_fffffffffffffcac;
  stringstream local_340 [16];
  ostream local_330 [376];
  double local_1b8;
  quaternion<double> *local_1b0;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> local_1a8;
  result_type_conflict1 local_190;
  result_type_conflict1 local_188;
  result_type_conflict1 local_180;
  result_type_conflict1 local_178;
  quaternion<double> local_170;
  reference local_150;
  quaternion<double> *local_148;
  __normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
  local_140;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *local_138;
  result_type_conflict1 local_130;
  result_type_conflict1 local_128;
  result_type_conflict1 local_120;
  result_type_conflict1 local_118;
  quaternion<double> local_110;
  reference local_f0;
  quaternion<double> *local_e8;
  __normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
  local_e0;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *local_d8;
  result_type_conflict1 local_d0;
  result_type_conflict1 local_c8;
  result_type_conflict1 local_c0;
  result_type_conflict1 local_b8;
  quaternion<double> local_b0;
  reference local_90;
  quaternion<double> *local_88;
  __normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
  local_80;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *local_78;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> local_68;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> local_48 [2];
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> local_18;
  
  std::allocator<HAXX::quaternion<double>_>::allocator
            ((allocator<HAXX::quaternion<double>_> *)0x1dfcec);
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::vector
            ((vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *)
             in_stack_fffffffffffff9e0,CONCAT17(in_stack_fffffffffffff9df,in_stack_fffffffffffff9d8)
             ,in_stack_fffffffffffff9d0);
  std::allocator<HAXX::quaternion<double>_>::~allocator
            ((allocator<HAXX::quaternion<double>_> *)0x1dfd15);
  std::allocator<HAXX::quaternion<double>_>::allocator
            ((allocator<HAXX::quaternion<double>_> *)0x1dfd2a);
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::vector
            ((vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *)
             in_stack_fffffffffffff9e0,CONCAT17(in_stack_fffffffffffff9df,in_stack_fffffffffffff9d8)
             ,in_stack_fffffffffffff9d0);
  std::allocator<HAXX::quaternion<double>_>::~allocator
            ((allocator<HAXX::quaternion<double>_> *)0x1dfd53);
  std::allocator<HAXX::quaternion<double>_>::allocator
            ((allocator<HAXX::quaternion<double>_> *)0x1dfd68);
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::vector
            ((vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *)
             in_stack_fffffffffffff9e0,CONCAT17(in_stack_fffffffffffff9df,in_stack_fffffffffffff9d8)
             ,in_stack_fffffffffffff9d0);
  std::allocator<HAXX::quaternion<double>_>::~allocator
            ((allocator<HAXX::quaternion<double>_> *)0x1dfd91);
  local_78 = local_48;
  local_80._M_current =
       (quaternion<double> *)
       std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::begin
                 ((vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *)
                  in_stack_fffffffffffff9b8);
  local_88 = (quaternion<double> *)
             std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::end
                       ((vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                         *)in_stack_fffffffffffff9b8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
                        *)in_stack_fffffffffffff9c0,
                       (__normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
                        *)in_stack_fffffffffffff9b8);
    if (!bVar1) break;
    local_90 = __gnu_cxx::
               __normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
               ::operator*(&local_80);
    local_b8 = std::uniform_real_distribution<double>::operator()
                         (in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8);
    local_c0 = std::uniform_real_distribution<double>::operator()
                         (in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8);
    local_c8 = std::uniform_real_distribution<double>::operator()
                         (in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8);
    local_d0 = std::uniform_real_distribution<double>::operator()
                         (in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8);
    HAXX::quaternion<double>::quaternion(&local_b0,&local_b8,&local_c0,&local_c8,&local_d0);
    local_90->_M_real = local_b0._M_real;
    local_90->_M_imag_i = local_b0._M_imag_i;
    local_90->_M_imag_j = local_b0._M_imag_j;
    local_90->_M_imag_k = local_b0._M_imag_k;
    __gnu_cxx::
    __normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
    ::operator++(&local_80);
  }
  local_d8 = &local_68;
  local_e0._M_current =
       (quaternion<double> *)
       std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::begin
                 ((vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *)
                  in_stack_fffffffffffff9b8);
  local_e8 = (quaternion<double> *)
             std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::end
                       ((vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                         *)in_stack_fffffffffffff9b8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
                        *)in_stack_fffffffffffff9c0,
                       (__normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
                        *)in_stack_fffffffffffff9b8);
    if (!bVar1) break;
    local_f0 = __gnu_cxx::
               __normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
               ::operator*(&local_e0);
    local_118 = std::uniform_real_distribution<double>::operator()
                          (in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8);
    local_120 = std::uniform_real_distribution<double>::operator()
                          (in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8);
    local_128 = std::uniform_real_distribution<double>::operator()
                          (in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8);
    local_130 = std::uniform_real_distribution<double>::operator()
                          (in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8);
    HAXX::quaternion<double>::quaternion(&local_110,&local_118,&local_120,&local_128,&local_130);
    local_f0->_M_real = local_110._M_real;
    local_f0->_M_imag_i = local_110._M_imag_i;
    local_f0->_M_imag_j = local_110._M_imag_j;
    local_f0->_M_imag_k = local_110._M_imag_k;
    __gnu_cxx::
    __normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
    ::operator++(&local_e0);
  }
  local_138 = &local_18;
  local_140._M_current =
       (quaternion<double> *)
       std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::begin
                 ((vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *)
                  in_stack_fffffffffffff9b8);
  local_148 = (quaternion<double> *)
              std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::end
                        ((vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                          *)in_stack_fffffffffffff9b8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
                        *)in_stack_fffffffffffff9c0,
                       (__normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
                        *)in_stack_fffffffffffff9b8);
    iVar6 = (int32_t)((ulong)in_stack_fffffffffffff9f0 >> 0x20);
    if (!bVar1) break;
    local_150 = __gnu_cxx::
                __normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
                ::operator*(&local_140);
    local_178 = std::uniform_real_distribution<double>::operator()
                          (in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8);
    local_180 = std::uniform_real_distribution<double>::operator()
                          (in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8);
    local_188 = std::uniform_real_distribution<double>::operator()
                          (in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8);
    local_190 = std::uniform_real_distribution<double>::operator()
                          (in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8);
    HAXX::quaternion<double>::quaternion(&local_170,&local_178,&local_180,&local_188,&local_190);
    local_150->_M_real = local_170._M_real;
    local_150->_M_imag_i = local_170._M_imag_i;
    local_150->_M_imag_j = local_170._M_imag_j;
    local_150->_M_imag_k = local_170._M_imag_k;
    __gnu_cxx::
    __normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
    ::operator++(&local_140);
  }
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::vector
            (in_stack_fffffffffffffa10,in_stack_fffffffffffffa08);
  uVar7 = (undefined4)((ulong)in_stack_fffffffffffff9b8 >> 0x20);
  local_1b0 = (quaternion<double> *)genRandom<double>();
  local_1b8 = genRandom<double>();
  std::__cxx11::stringstream::stringstream(local_340);
  poVar2 = std::operator<<(local_330,"hblas2_gemv_square_");
  std::operator<<(poVar2,'N');
  std::operator<<(local_330,"R");
  std::operator<<(local_330,"R");
  std::operator<<(local_330,"_LDSame");
  std::__cxx11::stringstream::str();
  __x = (quaternion<double> *)
        std::operator<<((ostream *)&std::cout,(string *)&stack0xfffffffffffffca0);
  __y = (quaternion<double> *)std::operator<<((ostream *)__x," will use");
  std::ostream::operator<<(__y,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffca0);
  poVar2 = std::operator<<((ostream *)&std::cout,"  ALPHA = ");
  pvVar3 = (void *)std::ostream::operator<<(poVar2,(double)local_1b0);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  INCY = (int32_t)pvVar3;
  Y_00 = (quaternion<double> *)std::operator<<((ostream *)&std::cout,"  BETA = ");
  pvVar3 = (void *)std::ostream::operator<<(Y_00,local_1b8);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  INCX = (int32_t)pvVar3;
  __n = 0;
  __q = local_1b0;
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::operator[]
            (&local_18,0);
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::operator[]
            (local_48,__n);
  __x_00 = std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::
           operator[](&local_68,__n);
  uVar4 = 1;
  __y_00 = (quaternion<double> *)CONCAT44(uVar7,1);
  HAXX::HBLAS_GEMV<double,HAXX::quaternion<double>,HAXX::quaternion<double>,double,double>
            ((char)((ulong)__q >> 0x38),(int32_t)__q,(int32_t)(__n >> 0x20),
             (double)CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00),
             in_stack_fffffffffffff9f8,iVar6,in_stack_fffffffffffff9e8,INCX,
             (double)in_stack_fffffffffffff9e0,Y_00,INCY);
  iVar9 = 0;
  while (iVar6 = (int32_t)((ulong)in_stack_fffffffffffffc88 >> 0x20), iVar9 < 100) {
    iVar8 = 0;
    uVar7 = 100;
    local_398 = 0.0;
    local_3a0 = 0.0;
    local_3a8 = 0.0;
    local_3b0 = 0.0;
    INCX_00 = iVar9;
    HAXX::quaternion<double>::quaternion
              ((quaternion<double> *)&local_390,&local_398,&local_3a0,&local_3a8,&local_3b0);
    std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::operator[]
              (&local_18,(long)(iVar9 + iVar8 * 100));
    std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::operator[]
              (local_48,0);
    HAXX::HBLAS_DOTUV<double>
              (in_stack_fffffffffffffcac,in_stack_fffffffffffffca0,INCX_00,
               (quaternion<double> *)CONCAT44(iVar8,uVar7),iVar6);
    local_390 = local_3d0;
    local_388 = local_3c8;
    local_380 = local_3c0;
    in_stack_fffffffffffffc88 = local_3b8;
    do {
      uVar5 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_3e0,
                 "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/hblas2.cxx"
                 ,0x58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)__x_00);
      boost::unit_test::unit_test_log_t::set_checkpoint(uVar5,&local_3e0,0x47,local_3f0);
      HAXX::operator*(&__x_00->_M_real,__y_00);
      std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::operator[]
                (&local_1a8,(long)INCX_00);
      HAXX::operator*(&__x_00->_M_real,__y_00);
      HAXX::operator+(__x_00,__y_00);
      std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::operator[]
                (&local_68,(long)INCX_00);
      HAXX::inv<double>(__q);
      HAXX::operator*(__x,__y);
      local_4d0 = 0x3ff0000000000000;
      HAXX::operator-(__x_00,&__y_00->_M_real);
      pv_ = (undefined1)((ulong)__y_00 >> 0x38);
      HAXX::norm<double>(in_stack_fffffffffffff9e0);
      boost::test_tools::assertion_result::assertion_result((assertion_result *)__x_00,(bool)pv_);
      in_stack_fffffffffffff9e0 = (quaternion<double> *)boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_500,
                 "( HAXX::norm(((ALPHA*tmp + BETA*YC[i]) * HAXX::inv(Y[i]))- 1.) < 1e-12 )",0x48);
      boost::unit_test::operator<<
                ((lazy_ostream *)CONCAT44(in_stack_fffffffffffff9cc,uVar4),
                 (basic_cstring<const_char> *)__x_00);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_510,
                 "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/hblas2.cxx"
                 ,0x58);
      __y_00 = (quaternion<double> *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_408,local_4f0,&local_510,0x47,1,0);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)0x1e092c);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)0x1e0939);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    iVar9 = INCX_00 + 1;
  }
  std::__cxx11::stringstream::~stringstream(local_340);
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::~vector
            ((vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *)
             in_stack_fffffffffffff9d0);
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::~vector
            ((vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *)
             in_stack_fffffffffffff9d0);
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::~vector
            ((vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *)
             in_stack_fffffffffffff9d0);
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::~vector
            ((vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *)
             in_stack_fffffffffffff9d0);
  return;
}

Assistant:

void hblas2_gemv_square_LDSame() {

  // Random Quaternion vectors and matricies
  std::vector<HAXX::quaternion<double>> 
    A(HBLAS2_MATLEN), X(HBLAS1_VECLEN), Y(HBLAS1_VECLEN);

  for(auto &x : X) 
    x = HAXX::quaternion<double>(dis(gen),dis(gen),dis(gen),dis(gen));
  for(auto &x : Y) 
    x = HAXX::quaternion<double>(dis(gen),dis(gen),dis(gen),dis(gen));
  for(auto &x : A) 
    x = HAXX::quaternion<double>(dis(gen),dis(gen),dis(gen),dis(gen));

  std::vector<HAXX::quaternion<double>> YC(Y);

  _AlphaF ALPHA = genRandom<_AlphaF>();
  _BetaF  BETA = genRandom<_BetaF>();

  std::stringstream ss;

  ss << "hblas2_gemv_square_" << _TA;
  if(std::is_same<double,_AlphaF>::value) ss << "R";
  else if(std::is_same<std::complex<double>,_AlphaF>::value) ss << "C";
  else ss << "Q";
  if(std::is_same<double,_BetaF>::value) ss << "R";
  else if(std::is_same<std::complex<double>,_BetaF>::value) ss << "C";
  else ss << "Q";
  ss << "_LDSame";

  std::cout << ss.str() << " will use" << std::endl;
  std::cout << "  ALPHA = " << ALPHA << std::endl;
  std::cout << "  BETA = " << BETA << std::endl;

  HBLAS_GEMV(_TA,HBLAS1_VECLEN,HBLAS1_VECLEN,ALPHA,&A[0],HBLAS1_VECLEN,&X[0],1,
    BETA,&Y[0],1);

  for(int i = 0; i < HBLAS1_VECLEN; i++) {
    HAXX_INT AROW = 0;
    HAXX_INT ACOL = i;
    HAXX_INT AStride = 1;
    if( _TA == 'N' ) {
      AROW = i;
      ACOL = 0;
      AStride = HBLAS1_VECLEN;
    }

    HAXX::quaternion<double> tmp;
    if( _TA == 'C' )
      tmp = HBLAS_DOTCV(HBLAS1_VECLEN,&A[RANK2_INDX(AROW,ACOL,HBLAS1_VECLEN)],
          AStride,&X[0],1);
    else
      tmp = HBLAS_DOTUV(HBLAS1_VECLEN,&A[RANK2_INDX(AROW,ACOL,HBLAS1_VECLEN)],
          AStride,&X[0],1);

    BOOST_CHECK(CMP_Q(ALPHA*tmp + BETA*YC[i],Y[i]));
  }

}